

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_grammar.cpp
# Opt level: O0

int Omega_h::find_goal_symbol(Grammar *g)

{
  int iVar1;
  bool bVar2;
  vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_> *this;
  reference pPVar3;
  reference piVar4;
  size_type sVar5;
  const_reference pvVar6;
  ostream *poVar7;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar8;
  int local_a8;
  int local_a4;
  int s_1;
  int result;
  undefined1 local_98;
  int local_7c;
  const_iterator cStack_78;
  int s;
  const_iterator __end2;
  const_iterator __begin2;
  RHS *__range2;
  Production *p;
  const_iterator __end1;
  const_iterator __begin1;
  Productions *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> nonterminals_in_rhss;
  Grammar *g_local;
  
  nonterminals_in_rhss._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)g;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  this = (vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_> *)
         (nonterminals_in_rhss._M_t._M_impl.super__Rb_tree_header._M_node_count + 8);
  __end1 = std::vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
           ::begin(this);
  p = (Production *)
      std::vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>::end
                (this);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Omega_h::Grammar::Production_*,_std::vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>_>
                                *)&p);
    if (!bVar2) {
      local_a4 = -1;
      local_a8 = *(int *)(nonterminals_in_rhss._M_t._M_impl.super__Rb_tree_header._M_node_count + 4)
      ;
      do {
        iVar1 = local_a4;
        if (*(int *)nonterminals_in_rhss._M_t._M_impl.super__Rb_tree_header._M_node_count <=
            local_a8) {
          if (local_a4 != -1) {
            std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
            return iVar1;
          }
          std::operator<<((ostream *)&std::cerr,
                          "ERROR: the root nonterminal is unclear for this grammar\n");
          abort();
        }
        sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,&local_a8);
        if (sVar5 == 0) {
          if (local_a4 != -1) {
            std::operator<<((ostream *)&std::cerr,"ERROR: there is more than one root nonterminal ("
                           );
            pvVar6 = at<std::__cxx11::string>
                               ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(nonterminals_in_rhss._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count + 0x20),local_a4);
            poVar7 = std::operator<<((ostream *)&std::cerr,(string *)pvVar6);
            poVar7 = std::operator<<(poVar7," and ");
            pvVar6 = at<std::__cxx11::string>
                               ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(nonterminals_in_rhss._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count + 0x20),local_a8);
            poVar7 = std::operator<<(poVar7,(string *)pvVar6);
            std::operator<<(poVar7,") in this grammar\n");
            abort();
          }
          local_a4 = local_a8;
        }
        local_a8 = local_a8 + 1;
      } while( true );
    }
    pPVar3 = __gnu_cxx::
             __normal_iterator<const_Omega_h::Grammar::Production_*,_std::vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>_>
             ::operator*(&__end1);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(&pPVar3->rhs);
    cStack_78 = std::vector<int,_std::allocator<int>_>::end(&pPVar3->rhs);
    while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff88), bVar2) {
      piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      local_7c = *piVar4;
      if (local_7c < 0) {
        fail("assertion %s failed at %s +%d\n","0 <= s",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_grammar.cpp"
             ,0x1f);
      }
      bVar2 = is_nonterminal((Grammar *)
                             nonterminals_in_rhss._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             local_7c);
      if (bVar2) {
        pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,&local_7c);
        _s_1 = pVar8.first._M_node;
        local_98 = pVar8.second;
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_Omega_h::Grammar::Production_*,_std::vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

int find_goal_symbol(Grammar const& g) {
  std::set<int> nonterminals_in_rhss;
  for (auto& p : g.productions) {
    for (auto s : p.rhs) {
      OMEGA_H_CHECK(0 <= s);
      if (is_nonterminal(g, s)) nonterminals_in_rhss.insert(s);
    }
  }
  int result = -1;
  for (int s = g.nterminals; s < g.nsymbols; ++s)
    if (!nonterminals_in_rhss.count(s)) {
      if (result != -1) {
        std::cerr << "ERROR: there is more than one root nonterminal (";
        std::cerr << at(g.symbol_names, result) << " and "
                  << at(g.symbol_names, s) << ") in this grammar\n";
        abort();
      }
      result = s;
    }
  if (result == -1) {
    std::cerr << "ERROR: the root nonterminal is unclear for this grammar\n";
    abort();
  }
  return result;
}